

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec.h
# Opt level: O1

int __thiscall vec<WatchElem>::remove(vec<WatchElem> *this,char *__filename)

{
  uint uVar1;
  long lVar2;
  anon_union_8_2_743a5d44_for_WatchElem_0 aVar3;
  long lVar4;
  long lVar5;
  bool bVar6;
  
  uVar1 = this->sz;
  aVar3._a._4_4_ = 0;
  aVar3._a._0_4_ = uVar1;
  bVar6 = uVar1 != 0;
  if (bVar6) {
    if ((this->data->field_0)._pt == (Clause *)*(uint64_t *)__filename) {
      lVar4 = 0;
    }
    else {
      lVar5 = 0;
      do {
        if (uVar1 - 1 == (int)lVar5) goto LAB_001c3631;
        lVar4 = lVar5 + 1;
        lVar2 = lVar5 + 1;
        lVar5 = lVar4;
      } while ((&this->data->field_0)[lVar2]._pt != (Clause *)*(uint64_t *)__filename);
      bVar6 = (uint)lVar4 < uVar1;
    }
    if (bVar6) {
      aVar3 = (anon_union_8_2_743a5d44_for_WatchElem_0)this->data[uVar1 - 1].field_0._a;
      this->data[lVar4].field_0._a = (uint64_t)aVar3;
      this->sz = this->sz - 1;
    }
  }
LAB_001c3631:
  return (int)aVar3._a;
}

Assistant:

void remove(const T& t) {
		unsigned int j;
		for (j = 0; j < sz && data[j] != t; j++) {
			;
		}
		if (j < sz) {
			data[j] = last();
			pop();
		}
	}